

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

SRes LzmaProps_Decode(CLzmaProps *p,Byte *data,uint size)

{
  byte bVar1;
  uint uVar2;
  SRes SVar3;
  
  SVar3 = 4;
  if (4 < size) {
    uVar2 = 0x1000;
    if (0x1000 < *(uint *)(data + 1)) {
      uVar2 = *(uint *)(data + 1);
    }
    p->dicSize = uVar2;
    bVar1 = *data;
    if (bVar1 < 0xe1) {
      uVar2 = bVar1 / 9;
      p->lc = (uint)(byte)(bVar1 + (char)uVar2 * -9);
      p->pb = uVar2 / 5;
      p->lp = uVar2 % 5;
      SVar3 = 0;
    }
  }
  return SVar3;
}

Assistant:

SRes LzmaProps_Decode(CLzmaProps *p, const Byte *data, unsigned size)
{
  UInt32 dicSize;
  Byte d;
  
  if (size < LZMA_PROPS_SIZE)
    return SZ_ERROR_UNSUPPORTED;
  else
    dicSize = data[1] | ((UInt32)data[2] << 8) | ((UInt32)data[3] << 16) | ((UInt32)data[4] << 24);
 
  if (dicSize < LZMA_DIC_MIN)
    dicSize = LZMA_DIC_MIN;
  p->dicSize = dicSize;

  d = data[0];
  if (d >= (9 * 5 * 5))
    return SZ_ERROR_UNSUPPORTED;

  p->lc = d % 9;
  d /= 9;
  p->pb = d / 5;
  p->lp = d % 5;

  return SZ_OK;
}